

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_runner_platform.c
# Opt level: O1

void run_test_in_its_own_process(TestSuite *suite,CgreenTest *test,TestReporter *reporter)

{
  int iVar1;
  uint32_t uVar2;
  __pid_t _Var3;
  uint32_t end_time_in_milliseconds;
  char *pcVar4;
  uint *puVar5;
  uint uVar6;
  int status;
  uint local_a8 [32];
  
  puVar5 = local_a8;
  uVar2 = cgreen_time_get_current_milliseconds();
  (*reporter->start_test)(reporter,test->name);
  if (test->skip != 0) {
    send_reporter_skipped_notification(reporter);
    (*reporter->finish_test)(reporter,test->filename,test->line,(char *)0x0);
    return;
  }
  fflush((FILE *)0x0);
  _Var3 = fork();
  if (_Var3 < 0) {
    die("Could not fork process\n");
  }
  if (_Var3 != 0) {
    local_a8[0] = 0;
    signal(2,(__sighandler_t)0x1);
    wait(local_a8);
    signal(2,(__sighandler_t)0x0);
    uVar6 = local_a8[0];
    end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
    uVar2 = cgreen_time_duration_in_milliseconds(uVar2,end_time_in_milliseconds);
    reporter->duration = uVar2;
    uVar6 = uVar6 & 0x7f;
    if ((uVar6 == 6) || ((int)(uVar6 * 0x1000000 + 0x1000000) < 0x2000000)) {
      pcVar4 = test->filename;
      iVar1 = test->line;
      puVar5 = (uint *)0x0;
    }
    else {
      pcVar4 = strsignal(uVar6);
      __snprintf_chk(local_a8,0x80,1,0x80,"Test terminated with signal: %s",pcVar4);
      pcVar4 = test->filename;
      iVar1 = test->line;
    }
    (*reporter->finish_test)(reporter,pcVar4,iVar1,(char *)puVar5);
    return;
  }
  run_the_test_code(suite,test,reporter);
  send_reporter_completion_notification(reporter);
  stop();
  return;
}

Assistant:

void run_test_in_its_own_process(TestSuite *suite, CgreenTest *test, TestReporter *reporter) {
    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_test)(reporter, test->name);
    if (test->skip) {
        send_reporter_skipped_notification(reporter);
        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    } else if (in_child_process()) {
        run_the_test_code(suite, test, reporter);
        send_reporter_completion_notification(reporter);
        stop();
    } else {
        const int status = wait_for_child_process();
        reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                                      cgreen_time_get_current_milliseconds());
        if (WIFSIGNALED(status)) {
            /* a C++ exception generates SIGABRT. Only print our special message for other signals. */
            const int sig = WTERMSIG(status);
            if (sig != SIGABRT) {
                char buf[128];
                snprintf(buf, sizeof(buf), "Test terminated with signal: %s", (const char *)strsignal(sig));
                (*reporter->finish_test)(reporter, test->filename, test->line, buf);
                return;
            }
        }

        (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
    }
}